

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bad_alloc *anon_var_1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [32];
  _union_1457 _Stack_198;
  sigaction sa;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parquetOutFiles;
  bool parquetOutput;
  FILE *fout [3];
  bool ordOutput;
  bool skipHeader;
  int opt;
  char **argv_local;
  int argc_local;
  
  fout[2]._3_1_ = 0;
  fout[2]._2_1_ = 0;
  memset(&stack0xffffffffffffffc8,0,0x18);
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_70);
  do {
    fout[2]._4_4_ = getopt(argc,argv,"HvhM:m:Q:q:S:s:");
    pcVar1 = _optarg;
    if (fout[2]._4_4_ == -1) {
      if ((parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
        fprintf(_stderr,
                "FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
               );
        exit(1);
      }
      sa.sa_mask.__val[0xe] = 0;
      sa.sa_mask.__val[0xf] = 0;
      sa.sa_mask.__val[0xc] = 0;
      sa.sa_mask.__val[0xd] = 0;
      sa.sa_mask.__val[10] = 0;
      sa.sa_mask.__val[0xb] = 0;
      sa.sa_mask.__val[8] = 0;
      sa.sa_mask.__val[9] = 0;
      sa.sa_mask.__val[6] = 0;
      sa.sa_mask.__val[7] = 0;
      sa.sa_mask.__val[4] = 0;
      sa.sa_mask.__val[5] = 0;
      sa.sa_mask.__val[2] = 0;
      sa.sa_mask.__val[3] = 0;
      sa.sa_mask.__val[0] = 0;
      sa.sa_mask.__val[1] = 0;
      _Stack_198.sa_handler = (__sighandler_t)0x0;
      sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
      sa.sa_flags = 0;
      sa._140_4_ = 0;
      sigemptyset((sigset_t *)&sa);
      _Stack_198.sa_handler = segfault_sigaction;
      sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
      sigaction(0xb,(sigaction *)&_Stack_198,(sigaction *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"",&local_1b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"",(allocator *)((long)&anon_var_1 + 7));
      initstreams((string *)local_1b8,(string *)local_1e0);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_1 + 7));
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      pltcalc::doit((bool)(fout[2]._3_1_ & 1),(bool)(fout[2]._2_1_ & 1),
                    (FILE **)&stack0xffffffffffffffc8,
                    (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_70);
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_70);
      return 0;
    }
    switch(fout[2]._4_4_) {
    case 0x48:
      fout[2]._3_1_ = 1;
      break;
    case 0x4d:
      fout[2]._2_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar1,&local_91);
      openpipe(0,(string *)local_90,(FILE **)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      break;
    case 0x51:
      fout[2]._2_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
      openpipe(2,(string *)local_c8,(FILE **)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      break;
    case 0x53:
      fout[2]._2_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,pcVar1,&local_f1);
      openpipe(1,(string *)local_f0,(FILE **)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      break;
    case 0x68:
    default:
      help();
      exit(1);
    case 0x6d:
      parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      break;
    case 0x71:
      parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      break;
    case 0x73:
      parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{

	enum { MPLT = 0, SPLT, QPLT };

	int opt;
	bool skipHeader = false;
	bool ordOutput = false;
	FILE * fout[] = { nullptr, nullptr, nullptr };
	bool parquetOutput = false;
	std::map<int, std::string> parquetOutFiles;
	while ((opt = getopt(argc, argv, "HvhM:m:Q:q:S:s:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			::exit(EXIT_FAILURE);
			break;
		case 'M':
			ordOutput = true;
			openpipe(MPLT, optarg, fout);
			break;
		case 'm':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::MPLT] = optarg;
#endif
			break;
		case 'Q':
			ordOutput = true;
			openpipe(QPLT, optarg, fout);
			break;
		case 'q':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::QPLT] = optarg;
#endif
			break;
		case 'S':
			ordOutput = true;
			openpipe(SPLT, optarg, fout);
			break;
		case 's':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::SPLT] = optarg;
#endif
			break;
		case 'H':
			skipHeader = true;
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquetOutput) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
		pltcalc::doit(skipHeader, ordOutput, fout, parquetOutFiles);
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	return EXIT_SUCCESS;
}